

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O3

void deqp::gls::StateQueryUtil::queryIndexedState
               (ResultCollector *result,CallLogWrapper *gl,QueryType type,GLenum target,int index,
               QueriedState *state)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  undefined1 auVar5 [14];
  undefined1 auVar6 [12];
  unkbyte10 Var7;
  GLboolean v;
  bool bVar8;
  int iVar9;
  undefined7 extraout_var;
  long lVar10;
  bool *pbVar11;
  char cVar12;
  char cVar24;
  char cVar25;
  char cVar26;
  undefined1 auVar15 [16];
  undefined1 auVar20 [16];
  StateQueryMemoryWriteGuard<unsigned_char[4]> value_3;
  StateQueryMemoryWriteGuard<unsigned_char> value;
  ostringstream buf;
  StateQueryMemoryWriteGuard<unsigned_char[4]> local_35c;
  long *local_350;
  long local_348;
  long local_340 [2];
  Hex<2UL> local_330;
  undefined1 local_328 [32];
  void *local_308;
  long lStack_300;
  GLint64 local_2f8;
  GLint64 GStack_2f0;
  long local_2e8;
  long lStack_2e0;
  long local_2d8;
  long lStack_2d0;
  ios_base local_2b8 [272];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar13 [12];
  undefined1 auVar16 [16];
  undefined1 auVar14 [13];
  undefined1 auVar17 [16];
  undefined1 auVar23 [16];
  undefined1 auVar19 [16];
  undefined1 auVar18 [16];
  undefined2 uVar27;
  
  switch(type) {
  case QUERY_INDEXED_BOOLEAN:
    local_328._0_3_ = 0xdedede;
    glu::CallLogWrapper::glGetBooleani_v(gl,target,index,local_328 + 1);
    bVar8 = checkError(result,gl,"glGetBooleani_v");
    if (!bVar8) {
      return;
    }
    bVar8 = StateQueryMemoryWriteGuard<unsigned_char>::verifyValidity
                      ((StateQueryMemoryWriteGuard<unsigned_char> *)local_328,result);
    if (!bVar8) {
      return;
    }
    bVar8 = verifyBooleanValidity(result,local_328[1]);
    if (!bVar8) {
      return;
    }
    v = local_328[1];
    goto LAB_007ca526;
  case QUERY_INDEXED_BOOLEAN_VEC4:
    local_35c.m_preguard[0] = 0xde;
    local_35c.m_preguard[1] = 0xde;
    local_35c.m_preguard[2] = 0xde;
    local_35c.m_preguard[3] = 0xde;
    local_35c.m_value[0] = 0xde;
    local_35c.m_value[1] = 0xde;
    local_35c.m_value[2] = 0xde;
    local_35c.m_value[3] = 0xde;
    local_35c.m_postguard[0] = 0xde;
    local_35c.m_postguard[1] = 0xde;
    local_35c.m_postguard[2] = 0xde;
    local_35c.m_postguard[3] = 0xde;
    glu::CallLogWrapper::glGetBooleani_v(gl,target,index,local_35c.m_value);
    bVar8 = checkError(result,gl,"glGetBooleani_v");
    if (bVar8) {
      bVar8 = StateQueryMemoryWriteGuard<unsigned_char[4]>::verifyValidity(&local_35c,result);
      if (bVar8) {
        bVar1 = local_35c.m_value[0];
        bVar2 = local_35c.m_value[1];
        bVar3 = local_35c.m_value[2];
        bVar4 = local_35c.m_value[3];
        cVar12 = -((byte)((bVar1 == 0) * bVar1 | bVar1 != 0) == bVar1);
        cVar24 = -((byte)((bVar2 == 0) * bVar2 | bVar2 != 0) == bVar2);
        cVar25 = -((byte)((bVar3 == 0) * bVar3 | bVar3 != 0) == bVar3);
        cVar26 = -((byte)((bVar4 == 0) * bVar4 | bVar4 != 0) == bVar4);
        auVar13._0_11_ = ZEXT411(0xffffffff) << 0x38;
        auVar13[0xb] = 0xff;
        auVar14[0xc] = 0xff;
        auVar14._0_12_ = auVar13;
        auVar19[0xd] = 0xff;
        auVar19._0_13_ = auVar14;
        auVar19[0xe] = 0xff;
        auVar19[0xf] = 0xff;
        auVar18._14_2_ = auVar19._14_2_;
        auVar18[0xd] = 0xff;
        auVar18._0_13_ = auVar14;
        auVar17._13_3_ = auVar18._13_3_;
        auVar17[0xc] = 0xff;
        auVar17._0_12_ = auVar13;
        auVar16._12_4_ = auVar17._12_4_;
        auVar16[0xb] = 0xff;
        auVar16._0_11_ = auVar13._0_11_;
        Var7 = CONCAT91(CONCAT81((long)(CONCAT72((int7)(CONCAT63((int6)(CONCAT54(auVar16._11_5_,
                                                                                 0xffffffff) >> 0x18
                                                                       ),0xffffff) >> 0x10),0xffff)
                                       >> 8),cVar26),cVar26);
        auVar6._2_10_ = Var7;
        auVar6[1] = cVar25;
        auVar6[0] = cVar25;
        auVar5._2_12_ = auVar6;
        auVar5[1] = cVar24;
        auVar5[0] = cVar24;
        auVar15._0_2_ = CONCAT11(cVar12,cVar12);
        auVar15._2_14_ = auVar5;
        uVar27 = (undefined2)Var7;
        auVar23._0_12_ = auVar15._0_12_;
        auVar23._12_2_ = uVar27;
        auVar23._14_2_ = uVar27;
        auVar22._12_4_ = auVar23._12_4_;
        auVar22._0_10_ = auVar15._0_10_;
        auVar22._10_2_ = auVar6._0_2_;
        auVar21._10_6_ = auVar22._10_6_;
        auVar21._0_8_ = auVar15._0_8_;
        auVar21._8_2_ = auVar6._0_2_;
        auVar20._8_8_ = auVar21._8_8_;
        auVar20._6_2_ = auVar5._0_2_;
        auVar20._4_2_ = auVar5._0_2_;
        auVar20._2_2_ = auVar15._0_2_;
        auVar20._0_2_ = auVar15._0_2_;
        iVar9 = movmskps((int)CONCAT71(extraout_var,bVar8),auVar20);
        if (iVar9 == 0xf) {
          state->m_type = DATATYPE_BOOLEAN_VEC4;
          (state->m_v).vBool = (bool)(-(bVar1 == 1) & 1);
          (state->m_v).vBooleanVec4[1] = (bool)(-(bVar2 == 1) & 1);
          (state->m_v).vBooleanVec4[2] = (bool)(-(bVar3 == 1) & 1);
          (state->m_v).vBooleanVec4[3] = (bool)(-(bVar4 == 1) & 1);
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "Boolean vec4 value was not neither GL_TRUE nor GL_FALSE, got (",0x3e);
          lVar10 = 0;
          do {
            pbVar11 = (bool *)0x9ce644;
            if (lVar10 == 0) {
              pbVar11 = gles31::Functional::SSBOArrayLengthTests::init::arraysSized + 1;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,pbVar11,(ulong)((uint)(lVar10 != 0) * 2));
            bVar1 = local_35c.m_value[lVar10];
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
            local_330.value = (ulong)bVar1;
            tcu::Format::Hex<2UL>::toStream(&local_330,(ostream *)local_328);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
            std::ios_base::~ios_base(local_2b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(char *)local_350,local_348);
            if (local_350 != local_340) {
              operator_delete(local_350,local_340[0] + 1);
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
          std::__cxx11::stringbuf::str();
          tcu::ResultCollector::fail(result,(string *)local_328);
          if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
            operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
          }
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
          std::ios_base::~ios_base(local_138);
        }
      }
    }
    break;
  case QUERY_INDEXED_ISENABLED:
    v = glu::CallLogWrapper::glIsEnabledi(gl,target,index);
    bVar8 = checkError(result,gl,"glIsEnabledi");
    if (!bVar8) {
      return;
    }
    bVar8 = verifyBooleanValidity(result,v);
    if (!bVar8) {
      return;
    }
LAB_007ca526:
    state->m_type = DATATYPE_BOOLEAN;
    (state->m_v).vBool = v == '\x01';
    break;
  case QUERY_INDEXED_INTEGER:
    local_328._0_8_ = (pointer)0xdededededededede;
    local_328._8_4_ = -0x21212122;
    glu::CallLogWrapper::glGetIntegeri_v(gl,target,index,(GLint *)(local_328 + 4));
    bVar8 = checkError(result,gl,"glGetIntegeri_v");
    if ((bVar8) &&
       (bVar8 = StateQueryMemoryWriteGuard<int>::verifyValidity
                          ((StateQueryMemoryWriteGuard<int> *)local_328,result), bVar8)) {
      state->m_type = DATATYPE_INTEGER;
      (state->m_v).vInt = local_328._4_4_;
    }
    break;
  case QUERY_INDEXED_INTEGER_VEC4:
    local_308 = (void *)0xdededededededede;
    lStack_300 = -0x2121212121212122;
    local_328._16_8_ = (void *)0xdededededededede;
    local_328._24_8_ = -0x2121212121212122;
    local_328._0_8_ = (pointer)0xdededededededede;
    local_328._8_8_ = 0xdededededededede;
    glu::CallLogWrapper::glGetIntegeri_v(gl,target,index,(GLint *)(local_328 + 0x10));
    bVar8 = checkError(result,gl,"glGetIntegeri_v");
    if ((bVar8) &&
       (bVar8 = StateQueryMemoryWriteGuard<int[4]>::verifyValidity
                          ((StateQueryMemoryWriteGuard<int[4]> *)local_328,result), bVar8)) {
      state->m_type = DATATYPE_INTEGER_VEC4;
      (state->m_v).vPtr = (void *)local_328._16_8_;
      (state->m_v).vInt64Vec4[1] = local_328._24_8_;
    }
    break;
  case QUERY_INDEXED_INTEGER64:
    local_328._16_8_ = 0xdededededededede;
    local_328._0_8_ = (pointer)0xdededededededede;
    local_328._8_8_ = (void *)0xdededededededede;
    glu::CallLogWrapper::glGetInteger64i_v(gl,target,index,(GLint64 *)(local_328 + 8));
    bVar8 = checkError(result,gl,"glGetInteger64i_v");
    if ((bVar8) &&
       (bVar8 = StateQueryMemoryWriteGuard<long>::verifyValidity
                          ((StateQueryMemoryWriteGuard<long> *)local_328,result), bVar8)) {
      state->m_type = DATATYPE_INTEGER64;
      (state->m_v).vPtr = (void *)local_328._8_8_;
    }
    break;
  case QUERY_INDEXED_INTEGER64_VEC4:
    local_2d8 = -0x2121212121212122;
    lStack_2d0 = -0x2121212121212122;
    local_2e8 = -0x2121212121212122;
    lStack_2e0 = -0x2121212121212122;
    local_2f8 = -0x2121212121212122;
    GStack_2f0 = -0x2121212121212122;
    local_308 = (void *)0xdededededededede;
    lStack_300 = -0x2121212121212122;
    local_328._16_8_ = 0xdededededededede;
    local_328._24_4_ = -0x21212122;
    local_328._28_4_ = -0x21212122;
    local_328._0_8_ = (pointer)0xdededededededede;
    local_328._8_8_ = 0xdededededededede;
    glu::CallLogWrapper::glGetInteger64i_v(gl,target,index,(GLint64 *)&local_308);
    bVar8 = checkError(result,gl,"glGetInteger64i_v");
    if ((bVar8) &&
       (bVar8 = StateQueryMemoryWriteGuard<long[4]>::verifyValidity
                          ((StateQueryMemoryWriteGuard<long[4]> *)local_328,result), bVar8)) {
      state->m_type = DATATYPE_INTEGER64_VEC4;
      (state->m_v).vPtr = local_308;
      (state->m_v).vInt64Vec4[1] = lStack_300;
      (state->m_v).vInt64Vec4[2] = local_2f8;
      (state->m_v).vInt64Vec4[3] = GStack_2f0;
    }
  }
  return;
}

Assistant:

void queryIndexedState (tcu::ResultCollector& result, glu::CallLogWrapper& gl, QueryType type, glw::GLenum target, int index, QueriedState& state)
{
	switch (type)
	{
		case QUERY_INDEXED_BOOLEAN_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLboolean[4]> value;
			gl.glGetBooleani_v(target, index, value);

			if (!checkError(result, gl, "glGetBooleani_v"))
				return;

			if (!value.verifyValidity(result))
				return;

			if (!verifyBooleanVec4Validity(result, value))
				return;

			{
				bool res[4];

				for (int i = 0; i < 4; i++)
					res[i] = value[i] == GL_TRUE;

				state = QueriedState(res);
			}

			break;
		}

		case QUERY_INDEXED_INTEGER_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLint[4]> value;
			gl.glGetIntegeri_v(target, index, value);

			if (!checkError(result, gl, "glGetIntegeri_v"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}

		case QUERY_INDEXED_INTEGER64_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLint64[4]> value;
			gl.glGetInteger64i_v(target, index, value);

			if (!checkError(result, gl, "glGetInteger64i_v"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}

		case QUERY_INDEXED_ISENABLED:
		{
			const glw::GLboolean value = gl.glIsEnabledi(target, index);

			if (!checkError(result, gl, "glIsEnabledi"))
				return;

			if (!verifyBooleanValidity(result, value))
				return;

			state = QueriedState(value == GL_TRUE);
			break;
		}

		case QUERY_INDEXED_BOOLEAN:
		{
			StateQueryMemoryWriteGuard<glw::GLboolean> value;
			gl.glGetBooleani_v(target, index, &value);

			if (!checkError(result, gl, "glGetBooleani_v"))
				return;

			if (!value.verifyValidity(result))
				return;
			if (!verifyBooleanValidity(result, value))
				return;

			state = QueriedState(value == GL_TRUE);
			break;
		}

		case QUERY_INDEXED_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetIntegeri_v(target, index, &value);

			if (!checkError(result, gl, "glGetIntegeri_v"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}

		case QUERY_INDEXED_INTEGER64:
		{
			StateQueryMemoryWriteGuard<glw::GLint64> value;
			gl.glGetInteger64i_v(target, index, &value);

			if (!checkError(result, gl, "glGetInteger64i_v"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
			break;
	}
}